

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
Chi2Test_abi_cxx11_(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *__return_storage_ptr__,Float *frequencies,Float *expFrequencies,int thetaRes,
                   int phiRes,int sampleCount,Float minExpFrequency,Float significanceLevel,
                   int numTests)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Float *pFVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  undefined8 uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  __normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_> __i;
  float *pfVar13;
  float *pfVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float fVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  string result;
  Float alpha;
  Float pval;
  undefined1 local_78 [8];
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Float local_54;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  int local_44;
  Float local_40;
  float local_3c;
  float local_38;
  int local_34;
  
  uVar12 = thetaRes * phiRes;
  if ((int)uVar12 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  local_40 = significanceLevel;
  if (uVar12 == 0) {
    pfVar14 = (float *)0x0;
    pfVar8 = (float *)0x0;
LAB_002acb5b:
    iVar11 = 0;
    fVar24 = 0.0;
    fVar22 = 0.0;
    fVar25 = 0.0;
  }
  else {
    lVar15 = (long)(int)uVar12;
    local_54 = minExpFrequency;
    local_50 = __return_storage_ptr__;
    local_44 = sampleCount;
    pfVar8 = (float *)operator_new(lVar15 * 0x10);
    pfVar14 = pfVar8 + lVar15 * 4;
    pfVar8[0] = 0.0;
    pfVar8[1] = 0.0;
    pfVar8[2] = 0.0;
    pfVar8[3] = 0.0;
    if (uVar12 == 1) {
      lVar15 = 1;
      bVar16 = false;
      pfVar13 = pfVar8 + 4;
    }
    else {
      uVar10 = 0x10;
      do {
        uVar6 = *(undefined8 *)(pfVar8 + 2);
        *(undefined8 *)((long)pfVar8 + uVar10) = *(undefined8 *)pfVar8;
        ((undefined8 *)((long)pfVar8 + uVar10))[1] = uVar6;
        uVar10 = uVar10 + 0x10;
      } while (lVar15 * 0x10 != uVar10);
      bVar16 = 0x10 < uVar12;
      pfVar13 = pfVar14;
    }
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar20 = vpbroadcastq_avx512f();
    uVar10 = 0;
    do {
      uVar5 = vpcmpuq_avx512f(auVar18,auVar20,2);
      auVar21 = vpsllq_avx512f(auVar18,4);
      pFVar2 = expFrequencies + uVar10;
      auVar17._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * (int)pFVar2[1];
      auVar17._0_4_ = (uint)((byte)uVar5 & 1) * (int)*pFVar2;
      auVar17._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * (int)pFVar2[2];
      auVar17._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * (int)pFVar2[3];
      auVar17._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * (int)pFVar2[4];
      auVar17._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * (int)pFVar2[5];
      auVar17._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * (int)pFVar2[6];
      auVar17._28_4_ = (uint)(byte)(uVar5 >> 7) * (int)pFVar2[7];
      uVar10 = uVar10 + 8;
      vscatterqps_avx512f(ZEXT864(pfVar8) + auVar21,uVar5,auVar17);
      vpscatterqq_avx512f(ZEXT864(pfVar8) + ZEXT864(8) + auVar21,uVar5,auVar18);
      auVar18 = vpaddq_avx512f(auVar18,auVar19);
    } while ((lVar15 + (ulong)(lVar15 == 0) + 7 & 0xfffffffffffffff8) != uVar10);
    __return_storage_ptr__ = local_50;
    if (pfVar8 == pfVar13) goto LAB_002acb5b;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
              (pfVar8,pfVar13,(int)LZCOUNT(lVar15) * 2 ^ 0x7e);
    if (bVar16) {
      pfVar9 = pfVar8 + 0x40;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
                (pfVar8,pfVar9);
      if (pfVar9 == pfVar13) goto LAB_002acb7d;
      do {
        fVar25 = *pfVar9;
        fVar24 = pfVar9[-4];
        fVar22 = pfVar9[3];
        local_70 = CONCAT44(local_70._4_4_,fVar22);
        local_78 = *(undefined1 (*) [8])(pfVar9 + 1);
        pfVar7 = pfVar9;
        while (fVar25 < fVar24) {
          *(undefined8 *)pfVar7 = *(undefined8 *)(pfVar7 + -4);
          *(undefined8 *)(pfVar7 + 2) = *(undefined8 *)(pfVar7 + -2);
          fVar24 = pfVar7[-8];
          pfVar7 = pfVar7 + -4;
        }
        pfVar9 = pfVar9 + 4;
        *pfVar7 = fVar25;
        *(undefined1 (*) [8])(pfVar7 + 1) = local_78;
        pfVar7[3] = fVar22;
      } while (pfVar9 != pfVar13);
      if (pfVar8 != pfVar13) goto LAB_002acb7d;
      iVar11 = 0;
      fVar24 = 0.0;
      fVar22 = 0.0;
      fVar25 = 0.0;
      __return_storage_ptr__ = local_50;
    }
    else {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,__gnu_cxx::__ops::_Iter_comp_iter<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>>
                (pfVar8,pfVar13);
LAB_002acb7d:
      fVar25 = 0.0;
      fVar24 = 0.0;
      iVar11 = 0;
      fVar22 = 0.0;
      pfVar9 = pfVar8;
      do {
        lVar15 = *(long *)(pfVar9 + 2);
        fVar3 = expFrequencies[lVar15];
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          if (local_54 <= fVar3) {
            fVar4 = frequencies[lVar15];
            if ((fVar24 <= 0.0) || (local_54 <= fVar24)) {
              iVar11 = iVar11 + 1;
              fVar22 = fVar22 + ((fVar4 - fVar3) * (fVar4 - fVar3)) / fVar3;
              goto LAB_002acc00;
            }
          }
          else {
            fVar4 = frequencies[lVar15];
          }
          fVar25 = fVar25 + fVar4;
          fVar24 = fVar24 + fVar3;
        }
        else if ((float)local_44 * 1e-05 < frequencies[lVar15]) {
          local_78 = (undefined1  [8])&local_68;
          local_70 = 0;
          local_68._M_local_buf[0] = '\0';
          pbrt::detail::stringPrintfRecursive<float_const&>
                    ((string *)local_78,
                     "Encountered %f samples in a c with expected frequency 0. Rejecting the null hypothesis!"
                     ,frequencies + lVar15);
          __return_storage_ptr__ = local_50;
          local_50->first = false;
          (local_50->second)._M_dataplus._M_p = (pointer)&(local_50->second).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50->second,local_78,(pointer)((long)local_78 + local_70));
          goto LAB_002acdfd;
        }
LAB_002acc00:
        pfVar9 = pfVar9 + 4;
        __return_storage_ptr__ = local_50;
      } while (pfVar9 != pfVar13);
    }
  }
  if ((0.0 < fVar24) || (0.0 < fVar25)) {
    iVar11 = iVar11 + 1;
    fVar22 = fVar22 + ((fVar25 - fVar24) * (fVar25 - fVar24)) / fVar24;
  }
  local_34 = iVar11 + -1;
  if (iVar11 < 2) {
    local_78 = (undefined1  [8])&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    pbrt::detail::stringPrintfRecursive<int&>
              ((string *)local_78,"The number of degrees of freedom %d is too low!",&local_34);
    __return_storage_ptr__->first = false;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_78,
               (pointer)((long)local_78 + local_70));
  }
  else {
    dVar23 = Chi2CDF((double)fVar22,local_34);
    fVar25 = 1.0 - (float)dVar23;
    local_38 = fVar25;
    local_3c = powf(1.0 - local_40,1.0 / (float)numTests);
    local_3c = 1.0 - local_3c;
    if (local_3c <= fVar25 && (uint)ABS(fVar25) < 0x7f800000) {
      local_78 = (undefined1  [8])&local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
      paVar1 = &(__return_storage_ptr__->second).field_2;
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      if (local_78 == (undefined1  [8])&local_68) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_68._8_8_;
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_78;
        (__return_storage_ptr__->second).field_2._M_allocated_capacity =
             CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
      }
      (__return_storage_ptr__->second)._M_string_length = local_70;
      goto LAB_002ace27;
    }
    local_78 = (undefined1  [8])&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    pbrt::detail::stringPrintfRecursive<float&,float&>
              ((string *)local_78,
               "Rejected the null hypothesis (p-value = %f, significance level = %f",&local_38,
               &local_3c);
    __return_storage_ptr__->first = false;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_78,
               (pointer)((long)local_78 + local_70));
  }
LAB_002acdfd:
  if (local_78 != (undefined1  [8])&local_68) {
    operator_delete((void *)local_78,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
LAB_002ace27:
  if (pfVar8 != (float *)0x0) {
    operator_delete(pfVar8,(long)pfVar14 - (long)pfVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> Chi2Test(const Float* frequencies,
                                      const Float* expFrequencies, int thetaRes,
                                      int phiRes, int sampleCount, Float minExpFrequency,
                                      Float significanceLevel, int numTests) {
    struct Cell {
        Float expFrequency;
        size_t index;
    };

    /* Sort all cells by their expected frequencies */
    std::vector<Cell> cells(thetaRes * phiRes);
    for (size_t i = 0; i < cells.size(); ++i) {
        cells[i].expFrequency = expFrequencies[i];
        cells[i].index = i;
    }
    std::sort(cells.begin(), cells.end(), [](const Cell& a, const Cell& b) {
        return a.expFrequency < b.expFrequency;
    });

    /* Compute the Chi^2 statistic and pool cells as necessary */
    Float pooledFrequencies = 0, pooledExpFrequencies = 0, chsq = 0;
    int pooledCells = 0, dof = 0;

    for (const Cell& c : cells) {
        if (expFrequencies[c.index] == 0) {
            if (frequencies[c.index] > sampleCount * 1e-5f) {
                /* Uh oh: samples in a c that should be completely empty
                   according to the probability density function. Ordinarily,
                   even a single sample requires immediate rejection of the null
                   hypothesis. But due to finite-precision computations and
                   rounding
                   errors, this can occasionally happen without there being an
                   actual bug. Therefore, the criterion here is a bit more
                   lenient. */

                std::string result =
                    StringPrintf("Encountered %f samples in a c with expected "
                                 "frequency 0. Rejecting the null hypothesis!",
                                 frequencies[c.index]);
                return std::make_pair(false, result);
            }
        } else if (expFrequencies[c.index] < minExpFrequency) {
            /* Pool cells with low expected frequencies */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else if (pooledExpFrequencies > 0 && pooledExpFrequencies < minExpFrequency) {
            /* Keep on pooling cells until a sufficiently high
               expected frequency is achieved. */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else {
            Float diff = frequencies[c.index] - expFrequencies[c.index];
            chsq += (diff * diff) / expFrequencies[c.index];
            ++dof;
        }
    }

    if (pooledExpFrequencies > 0 || pooledFrequencies > 0) {
        Float diff = pooledFrequencies - pooledExpFrequencies;
        chsq += (diff * diff) / pooledExpFrequencies;
        ++dof;
    }

    /* All parameters are assumed to be known, so there is no
       additional DF reduction due to model parameters */
    dof -= 1;

    if (dof <= 0) {
        std::string result =
            StringPrintf("The number of degrees of freedom %d is too low!", dof);
        return std::make_pair(false, result);
    }

    /* Probability of obtaining a test statistic at least
       as extreme as the one observed under the assumption
       that the distributions match */
    Float pval = 1 - (Float)Chi2CDF(chsq, dof);

    /* Apply the Sidak correction term, since we'll be conducting multiple
       independent
       hypothesis tests. This accounts for the fact that the probability of a
       failure
       increases quickly when several hypothesis tests are run in sequence. */
    Float alpha = 1.0f - std::pow(1.0f - significanceLevel, 1.0f / numTests);

    if (pval < alpha || !std::isfinite(pval)) {
        std::string result = StringPrintf("Rejected the null hypothesis (p-value = %f, "
                                          "significance level = %f",
                                          pval, alpha);
        return std::make_pair(false, result);
    } else {
        return std::make_pair(true, std::string(""));
    }
}